

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

floatx80 floatx80_default_nan_mipsel(float_status *status)

{
  flag fVar1;
  undefined8 extraout_RDX;
  floatx80 fVar2;
  float_status *status_local;
  floatx80 r;
  
  fVar1 = snan_bit_is_one(status);
  if (fVar1 == '\0') {
    fVar2._10_6_ = (undefined6)((ulong)extraout_RDX >> 0x10);
    fVar2.high = 0xffff;
    fVar2.low = 0xc000000000000000;
    return fVar2;
  }
  __assert_fail("!snan_bit_is_one(status)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                ,0xc5,"floatx80 floatx80_default_nan_mipsel(float_status *)");
}

Assistant:

floatx80 floatx80_default_nan(float_status *status)
{
    floatx80 r;

    /* None of the targets that have snan_bit_is_one use floatx80.  */
    assert(!snan_bit_is_one(status));
#if defined(TARGET_M68K)
    r.low = UINT64_C(0xFFFFFFFFFFFFFFFF);
    r.high = 0x7FFF;
#else
    /* X86 */
    r.low = UINT64_C(0xC000000000000000);
    r.high = 0xFFFF;
#endif
    return r;
}